

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O1

void Saig_ManSupport_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  void *pvVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar4 = uVar2 & 7;
    if (uVar4 == 1) {
      return;
    }
    if (uVar4 == 2) break;
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigCone.c"
                    ,0x3d,"void Saig_ManSupport_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Saig_ManSupport_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  if ((pObj->field_0).CioId < p->nTruePis) {
    return;
  }
  uVar2 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
  if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar1 = p->vCos->pArray[uVar2];
  uVar2 = vSupp->nCap;
  if (vSupp->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSupp->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSupp->pArray,0x80);
      }
      vSupp->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_00647c51;
      if (vSupp->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vSupp->pArray,(ulong)uVar2 << 4);
      }
      vSupp->pArray = ppvVar3;
    }
    vSupp->nCap = iVar5;
  }
LAB_00647c51:
  iVar5 = vSupp->nSize;
  vSupp->nSize = iVar5 + 1;
  vSupp->pArray[iVar5] = pvVar1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Counts the support size of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManSupport_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsLo(p,pObj) )
        {
            pObj = Saig_ManLi( p, Aig_ObjCioId(pObj)-Saig_ManPiNum(p) );
            Vec_PtrPush( vSupp, pObj );
        }
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManSupport_rec( p, Aig_ObjFanin0(pObj), vSupp );
    Saig_ManSupport_rec( p, Aig_ObjFanin1(pObj), vSupp );
}